

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Load::~Load(Load *this)

{
  ~Load((Load *)&this[-1].addr);
  return;
}

Assistant:

Load(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> addr)
      : IRInst(InstType::Load), Definition(std::move(dest)),
        addr(std::move(addr)) {}